

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t2.c
# Opt level: O3

OPJ_BOOL opj_t2_encode_packet
                   (OPJ_UINT32 tileno,opj_tcd_tile_t *tile,opj_tcp_t *tcp,opj_pi_iterator_t *pi,
                   OPJ_BYTE *dest,OPJ_UINT32 *p_data_written,OPJ_UINT32 length,
                   opj_codestream_info_t *cstr_info,J2K_T2_MODE p_t2_mode,opj_event_mgr_t *p_manager
                   )

{
  uint uVar1;
  uint uVar2;
  opj_tcd_resolution_t *poVar3;
  opj_tcd_precinct_t *poVar4;
  opj_packet_info_t *poVar5;
  bool bVar6;
  OPJ_BOOL OVar7;
  uint uVar8;
  opj_bio_t *bio;
  ulong uVar9;
  opj_tcd_pass_t *poVar10;
  OPJ_UINT32 n;
  int iVar11;
  OPJ_UINT32 OVar12;
  uint v;
  uint uVar13;
  opj_tcd_band_t *poVar14;
  opj_tcd_layer_t *poVar15;
  OPJ_UINT32 OVar16;
  OPJ_UINT32 v_00;
  int iVar17;
  opj_tcd_band_t *band;
  int iVar18;
  ulong uVar19;
  opj_tcd_cblk_enc_t *poVar20;
  uint uVar21;
  long lVar22;
  ulong uVar23;
  OPJ_UINT32 *pOVar24;
  uint uVar25;
  double dVar26;
  OPJ_BYTE *local_c8;
  uint local_94;
  
  uVar1 = pi->resno;
  uVar2 = pi->precno;
  uVar13 = pi->layno;
  uVar9 = (ulong)uVar13;
  poVar3 = tile->comps[pi->compno].resolutions;
  local_c8 = dest;
  if ((tcp->csty & 2) != 0) {
    if (length < 6) {
      if (p_t2_mode != FINAL_PASS) {
        return 0;
      }
      uVar23 = (ulong)length;
      uVar19 = 6;
      goto LAB_00135457;
    }
    dest[0] = 0xff;
    dest[1] = 0x91;
    dest[2] = '\0';
    dest[3] = '\x04';
    dest[4] = *(OPJ_BYTE *)((long)&tile->packno + 1);
    dest[5] = (OPJ_BYTE)tile->packno;
    length = length - 6;
    local_c8 = dest + 6;
  }
  if ((uVar9 == 0) && (poVar3[uVar1].numbands != 0)) {
    poVar14 = poVar3[uVar1].bands;
    uVar25 = 0;
    do {
      OVar7 = opj_tcd_is_band_empty(poVar14);
      if (OVar7 == 0) {
        poVar4 = poVar14->precincts;
        opj_tgt_reset(poVar4[uVar2].incltree);
        opj_tgt_reset(poVar4[uVar2].imsbtree);
        uVar8 = poVar4[uVar2].ch * poVar4[uVar2].cw;
        if (uVar8 != 0) {
          lVar22 = 0x34;
          uVar23 = 0;
          do {
            poVar20 = poVar4[uVar2].cblks.enc;
            *(undefined4 *)((long)&poVar20->data + lVar22) = 0;
            opj_tgt_setvalue(poVar4[uVar2].imsbtree,(OPJ_UINT32)uVar23,
                             poVar14->numbps - *(int *)((long)poVar20 + lVar22 + -0xc));
            uVar23 = uVar23 + 1;
            lVar22 = lVar22 + 0x40;
          } while (uVar8 != uVar23);
        }
      }
      uVar25 = uVar25 + 1;
      poVar14 = poVar14 + 1;
    } while (uVar25 < poVar3[uVar1].numbands);
  }
  bio = opj_bio_create();
  if (bio == (opj_bio_t *)0x0) {
    return 0;
  }
  opj_bio_init_enc(bio,local_c8,length);
  opj_bio_write(bio,1,1);
  poVar14 = poVar3[uVar1].bands;
  if (poVar3[uVar1].numbands != 0) {
    local_94 = 0;
    band = poVar14;
    do {
      OVar7 = opj_tcd_is_band_empty(band);
      if (OVar7 == 0) {
        poVar4 = band->precincts;
        OVar16 = poVar4[uVar2].ch * poVar4[uVar2].cw;
        if (OVar16 != 0) {
          pOVar24 = &(poVar4[uVar2].cblks.enc)->numpasses;
          OVar12 = 0;
          do {
            if ((*pOVar24 == 0) && ((*(opj_tcd_layer_t **)(pOVar24 + -0xb))[uVar9].numpasses != 0))
            {
              opj_tgt_setvalue(poVar4[uVar2].incltree,OVar12,uVar13);
            }
            OVar12 = OVar12 + 1;
            pOVar24 = pOVar24 + 0x10;
          } while (OVar16 != OVar12);
          poVar20 = poVar4[uVar2].cblks.enc;
          OVar12 = 0;
          do {
            poVar15 = poVar20->layers + uVar9;
            if (poVar20->numpasses == 0) {
              opj_tgt_encode(bio,poVar4[uVar2].incltree,OVar12,uVar13 + 1);
            }
            else {
              opj_bio_write(bio,(uint)(poVar15->numpasses != 0),1);
            }
            uVar25 = poVar15->numpasses;
            if (uVar25 != 0) {
              if (poVar20->numpasses == 0) {
                poVar20->numlenbits = 3;
                opj_tgt_encode(bio,poVar4[uVar2].imsbtree,OVar12,999);
                uVar25 = poVar15->numpasses;
              }
              if (uVar25 == 2) {
                v_00 = 2;
                n = 2;
LAB_00135037:
                opj_bio_write(bio,v_00,n);
              }
              else {
                if (uVar25 == 1) {
                  v_00 = 0;
                  n = 1;
                  goto LAB_00135037;
                }
                if (uVar25 < 6) {
                  v_00 = uVar25 - 3 | 0xc;
                  n = 4;
                  goto LAB_00135037;
                }
                if (uVar25 < 0x25) {
                  v_00 = uVar25 - 6 | 0x1e0;
                  n = 9;
                  goto LAB_00135037;
                }
                if (uVar25 < 0xa5) {
                  v_00 = uVar25 - 0x25 | 0xff80;
                  n = 0x10;
                  goto LAB_00135037;
                }
              }
              uVar25 = poVar20->numpasses;
              uVar23 = (ulong)uVar25;
              uVar21 = poVar15->numpasses + uVar25;
              v = 0;
              uVar8 = 0;
              iVar11 = 0;
              if (uVar25 < uVar21) {
                poVar10 = poVar20->passes + uVar23;
                v = 0;
                uVar8 = 0;
                iVar11 = 0;
                do {
                  uVar8 = uVar8 + 1;
                  v = v + poVar10->len;
                  if (((int)uVar23 == uVar21 - 1) || ((poVar10->field_0x14 & 1) != 0)) {
                    iVar17 = 1;
                    if (1 < (int)v) {
                      do {
                        iVar17 = iVar17 + 1;
                        bVar6 = 3 < v;
                        v = v >> 1;
                      } while (bVar6);
                    }
                    iVar18 = 0;
                    if (1 < (int)uVar8) {
                      iVar18 = 0;
                      uVar19 = (ulong)uVar8;
                      do {
                        iVar18 = iVar18 + -1;
                        uVar25 = (uint)uVar19;
                        uVar19 = uVar19 >> 1;
                      } while (3 < uVar25);
                    }
                    iVar18 = (iVar17 - poVar20->numlenbits) + iVar18;
                    if (iVar11 <= iVar18) {
                      iVar11 = iVar18;
                    }
                    v = 0;
                    uVar8 = 0;
                  }
                  poVar10 = poVar10 + 1;
                  uVar25 = (int)uVar23 + 1;
                  uVar23 = (ulong)uVar25;
                } while (uVar25 != uVar21);
                if (0 < iVar11) {
                  uVar25 = iVar11 + 1;
                  do {
                    opj_bio_write(bio,1,1);
                    uVar25 = uVar25 - 1;
                  } while (1 < uVar25);
                }
              }
              opj_bio_write(bio,0,1);
              poVar20->numlenbits = poVar20->numlenbits + iVar11;
              uVar23 = (ulong)poVar20->numpasses;
              if (poVar20->numpasses < uVar21) {
                poVar10 = poVar20->passes + uVar23;
                do {
                  uVar8 = uVar8 + 1;
                  v = v + poVar10->len;
                  if (((poVar10->field_0x14 & 1) != 0) ||
                     ((int)uVar23 == poVar20->numpasses + poVar15->numpasses + -1)) {
                    iVar11 = 0;
                    if (1 < (int)uVar8) {
                      iVar11 = 0;
                      do {
                        iVar11 = iVar11 + 1;
                        bVar6 = 3 < uVar8;
                        uVar8 = uVar8 >> 1;
                      } while (bVar6);
                    }
                    opj_bio_write(bio,v,iVar11 + poVar20->numlenbits);
                    v = 0;
                    uVar8 = 0;
                  }
                  poVar10 = poVar10 + 1;
                  uVar25 = (int)uVar23 + 1;
                  uVar23 = (ulong)uVar25;
                } while (uVar25 != uVar21);
              }
            }
            poVar20 = poVar20 + 1;
            OVar12 = OVar12 + 1;
          } while (OVar12 != OVar16);
        }
      }
      local_94 = local_94 + 1;
      band = band + 1;
    } while (local_94 < poVar3[uVar1].numbands);
  }
  OVar7 = opj_bio_flush(bio);
  if (OVar7 == 0) {
    opj_bio_destroy(bio);
    return 0;
  }
  uVar23 = opj_bio_numbytes(bio);
  local_c8 = local_c8 + (uVar23 & 0xffffffff);
  uVar13 = length - (int)uVar23;
  opj_bio_destroy(bio);
  if ((tcp->csty & 4) != 0) {
    uVar23 = (ulong)uVar13;
    if (uVar13 < 2) {
      if (p_t2_mode != FINAL_PASS) {
        return 0;
      }
      uVar19 = 2;
LAB_00135457:
      opj_event_msg(p_manager,1,
                    "opj_t2_encode_packet(): only %u bytes remaining in output buffer. %u needed.\n"
                    ,uVar23,uVar19);
      return 0;
    }
    local_c8[0] = 0xff;
    local_c8[1] = 0x92;
    local_c8 = local_c8 + 2;
    uVar13 = uVar13 - 2;
  }
  uVar23 = (ulong)uVar13;
  if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
    cstr_info->tile[tileno].packet[cstr_info->packno].end_ph_pos = (long)((int)local_c8 - (int)dest)
    ;
  }
  if (poVar3[uVar1].numbands != 0) {
    uVar13 = 0;
    do {
      OVar7 = opj_tcd_is_band_empty(poVar14);
      if (OVar7 == 0) {
        poVar4 = poVar14->precincts;
        iVar11 = poVar4[uVar2].ch * poVar4[uVar2].cw;
        if (iVar11 != 0) {
          pOVar24 = &(poVar4[uVar2].cblks.enc)->numpasses;
          do {
            if ((*(opj_tcd_layer_t **)(pOVar24 + -0xb))[uVar9].numpasses != 0) {
              poVar15 = *(opj_tcd_layer_t **)(pOVar24 + -0xb) + uVar9;
              uVar19 = (ulong)poVar15->len;
              if ((uint)uVar23 < poVar15->len) {
                if (p_t2_mode != FINAL_PASS) {
                  return 0;
                }
                goto LAB_00135457;
              }
              memcpy(local_c8,poVar15->data,uVar19);
              *pOVar24 = *pOVar24 + poVar15->numpasses;
              local_c8 = local_c8 + poVar15->len;
              uVar23 = (ulong)((uint)uVar23 - poVar15->len);
              if ((cstr_info != (opj_codestream_info_t *)0x0) && (cstr_info->index_write != 0)) {
                poVar5 = cstr_info->tile[tileno].packet;
                dVar26 = (double)poVar15->disto + poVar5[cstr_info->packno].disto;
                poVar5[cstr_info->packno].disto = dVar26;
                if (cstr_info->D_max <= dVar26 && dVar26 != cstr_info->D_max) {
                  cstr_info->D_max = dVar26;
                }
              }
            }
            pOVar24 = pOVar24 + 0x10;
            iVar11 = iVar11 + -1;
          } while (iVar11 != 0);
        }
      }
      uVar13 = uVar13 + 1;
      poVar14 = poVar14 + 1;
    } while (uVar13 < poVar3[uVar1].numbands);
  }
  if (local_c8 < dest) {
    __assert_fail("c >= dest",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/t2.c"
                  ,0x3bb,
                  "OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32, opj_tcd_tile_t *, opj_tcp_t *, opj_pi_iterator_t *, OPJ_BYTE *, OPJ_UINT32 *, OPJ_UINT32, opj_codestream_info_t *, J2K_T2_MODE, opj_event_mgr_t *)"
                 );
  }
  *p_data_written = *p_data_written + ((int)local_c8 - (int)dest);
  return 1;
}

Assistant:

static OPJ_BOOL opj_t2_encode_packet(OPJ_UINT32 tileno,
                                     opj_tcd_tile_t * tile,
                                     opj_tcp_t * tcp,
                                     opj_pi_iterator_t *pi,
                                     OPJ_BYTE *dest,
                                     OPJ_UINT32 * p_data_written,
                                     OPJ_UINT32 length,
                                     opj_codestream_info_t *cstr_info,
                                     J2K_T2_MODE p_t2_mode,
                                     opj_event_mgr_t *p_manager)
{
    OPJ_UINT32 bandno, cblkno;
    OPJ_BYTE* c = dest;
    OPJ_UINT32 l_nb_bytes;
    OPJ_UINT32 compno = pi->compno;     /* component value */
    OPJ_UINT32 resno  = pi->resno;      /* resolution level value */
    OPJ_UINT32 precno = pi->precno;     /* precinct value */
    OPJ_UINT32 layno  = pi->layno;      /* quality layer value */
    OPJ_UINT32 l_nb_blocks;
    opj_tcd_band_t *band = 00;
    opj_tcd_cblk_enc_t* cblk = 00;
    opj_tcd_pass_t *pass = 00;

    opj_tcd_tilecomp_t *tilec = &tile->comps[compno];
    opj_tcd_resolution_t *res = &tilec->resolutions[resno];

    opj_bio_t *bio = 00;    /* BIO component */
#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    OPJ_BOOL packet_empty = OPJ_TRUE;
#else
    OPJ_BOOL packet_empty = OPJ_FALSE;
#endif

    /* <SOP 0xff91> */
    if (tcp->csty & J2K_CP_CSTY_SOP) {
        if (length < 6) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 6);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 145;
        c[2] = 0;
        c[3] = 4;
#if 0
        c[4] = (tile->packno % 65536) / 256;
        c[5] = (tile->packno % 65536) % 256;
#else
        c[4] = (tile->packno >> 8) & 0xff; /* packno is uint32_t */
        c[5] = tile->packno & 0xff;
#endif
        c += 6;
        length -= 6;
    }
    /* </SOP> */

    if (!layno) {
        band = res->bands;

        for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
            opj_tcd_precinct_t *prc;

            /* Skip empty bands */
            if (opj_tcd_is_band_empty(band)) {
                continue;
            }

            prc = &band->precincts[precno];
            opj_tgt_reset(prc->incltree);
            opj_tgt_reset(prc->imsbtree);

            l_nb_blocks = prc->cw * prc->ch;
            for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
                cblk = &prc->cblks.enc[cblkno];

                cblk->numpasses = 0;
                opj_tgt_setvalue(prc->imsbtree, cblkno, band->numbps - (OPJ_INT32)cblk->numbps);
            }
        }
    }

    bio = opj_bio_create();
    if (!bio) {
        /* FIXME event manager error callback */
        return OPJ_FALSE;
    }
    opj_bio_init_enc(bio, c, length);

#ifdef ENABLE_EMPTY_PACKET_OPTIMIZATION
    /* WARNING: this code branch is disabled, since it has been reported that */
    /* such packets cause decoding issues with cinema J2K hardware */
    /* decoders: https://groups.google.com/forum/#!topic/openjpeg/M7M_fLX_Bco */

    /* Check if the packet is empty */
    /* Note: we could also skip that step and always write a packet header */
    band = res->bands;
    for (bandno = 0; bandno < res->numbands; ++bandno, ++band) {
        opj_tcd_precinct_t *prc;
        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++, ++cblk) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                continue;
            }
            packet_empty = OPJ_FALSE;
            break;
        }
        if (!packet_empty) {
            break;
        }
    }
#endif
    opj_bio_write(bio, packet_empty ? 0 : 1, 1);           /* Empty header bit */

    /* Writing Packet header */
    band = res->bands;
    for (bandno = 0; !packet_empty &&
            bandno < res->numbands; ++bandno, ++band)      {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!cblk->numpasses && layer->numpasses) {
                opj_tgt_setvalue(prc->incltree, cblkno, (OPJ_INT32)layno);
            }

            ++cblk;
        }

        cblk = prc->cblks.enc;
        for (cblkno = 0; cblkno < l_nb_blocks; cblkno++) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];
            OPJ_UINT32 increment = 0;
            OPJ_UINT32 nump = 0;
            OPJ_UINT32 len = 0, passno;
            OPJ_UINT32 l_nb_passes;

            /* cblk inclusion bits */
            if (!cblk->numpasses) {
                opj_tgt_encode(bio, prc->incltree, cblkno, (OPJ_INT32)(layno + 1));
            } else {
                opj_bio_write(bio, layer->numpasses != 0, 1);
            }

            /* if cblk not included, go to the next cblk  */
            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            /* if first instance of cblk --> zero bit-planes information */
            if (!cblk->numpasses) {
                cblk->numlenbits = 3;
                opj_tgt_encode(bio, prc->imsbtree, cblkno, 999);
            }

            /* number of coding passes included */
            opj_t2_putnumpasses(bio, layer->numpasses);
            l_nb_passes = cblk->numpasses + layer->numpasses;
            pass = cblk->passes +  cblk->numpasses;

            /* computation of the increase of the length indicator and insertion in the header     */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                ++nump;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    increment = (OPJ_UINT32)opj_int_max((OPJ_INT32)increment,
                                                        opj_int_floorlog2((OPJ_INT32)len) + 1
                                                        - ((OPJ_INT32)cblk->numlenbits + opj_int_floorlog2((OPJ_INT32)nump)));
                    len = 0;
                    nump = 0;
                }

                ++pass;
            }
            opj_t2_putcommacode(bio, (OPJ_INT32)increment);

            /* computation of the new Length indicator */
            cblk->numlenbits += increment;

            pass = cblk->passes +  cblk->numpasses;
            /* insertion of the codeword segment length */
            for (passno = cblk->numpasses; passno < l_nb_passes; ++passno) {
                nump++;
                len += pass->len;

                if (pass->term || passno == (cblk->numpasses + layer->numpasses) - 1) {
                    opj_bio_write(bio, (OPJ_UINT32)len,
                                  cblk->numlenbits + (OPJ_UINT32)opj_int_floorlog2((OPJ_INT32)nump));
                    len = 0;
                    nump = 0;
                }
                ++pass;
            }

            ++cblk;
        }
    }

    if (!opj_bio_flush(bio)) {
        opj_bio_destroy(bio);
        return OPJ_FALSE;               /* modified to eliminate longjmp !! */
    }

    l_nb_bytes = (OPJ_UINT32)opj_bio_numbytes(bio);
    c += l_nb_bytes;
    length -= l_nb_bytes;

    opj_bio_destroy(bio);

    /* <EPH 0xff92> */
    if (tcp->csty & J2K_CP_CSTY_EPH) {
        if (length < 2) {
            if (p_t2_mode == FINAL_PASS) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "opj_t2_encode_packet(): only %u bytes remaining in "
                              "output buffer. %u needed.\n",
                              length, 2);
            }
            return OPJ_FALSE;
        }
        c[0] = 255;
        c[1] = 146;
        c += 2;
        length -= 2;
    }
    /* </EPH> */

    /* << INDEX */
    /* End of packet header position. Currently only represents the distance to start of packet
       Will be updated later by incrementing with packet start value*/
    if (cstr_info && cstr_info->index_write) {
        opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
        info_PK->end_ph_pos = (OPJ_INT32)(c - dest);
    }
    /* INDEX >> */

    /* Writing the packet body */
    band = res->bands;
    for (bandno = 0; !packet_empty && bandno < res->numbands; bandno++, ++band) {
        opj_tcd_precinct_t *prc;

        /* Skip empty bands */
        if (opj_tcd_is_band_empty(band)) {
            continue;
        }

        prc = &band->precincts[precno];
        l_nb_blocks = prc->cw * prc->ch;
        cblk = prc->cblks.enc;

        for (cblkno = 0; cblkno < l_nb_blocks; ++cblkno) {
            opj_tcd_layer_t *layer = &cblk->layers[layno];

            if (!layer->numpasses) {
                ++cblk;
                continue;
            }

            if (layer->len > length) {
                if (p_t2_mode == FINAL_PASS) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "opj_t2_encode_packet(): only %u bytes remaining in "
                                  "output buffer. %u needed.\n",
                                  length, layer->len);
                }
                return OPJ_FALSE;
            }

            memcpy(c, layer->data, layer->len);
            cblk->numpasses += layer->numpasses;
            c += layer->len;
            length -= layer->len;

            /* << INDEX */
            if (cstr_info && cstr_info->index_write) {
                opj_packet_info_t *info_PK = &cstr_info->tile[tileno].packet[cstr_info->packno];
                info_PK->disto += layer->disto;
                if (cstr_info->D_max < info_PK->disto) {
                    cstr_info->D_max = info_PK->disto;
                }
            }

            ++cblk;
            /* INDEX >> */
        }
    }

    assert(c >= dest);
    * p_data_written += (OPJ_UINT32)(c - dest);

    return OPJ_TRUE;
}